

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O0

_Bool prof_gctx_should_destroy(prof_gctx_t *gctx)

{
  _Bool _Var1;
  long in_RDI;
  undefined1 local_1;
  
  if (duckdb_je_opt_prof_accum) {
    local_1 = false;
  }
  else {
    _Var1 = tctx_tree_empty((prof_tctx_tree_t *)(in_RDI + 0x10));
    if (_Var1) {
      if (*(int *)(in_RDI + 8) == 0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool
prof_gctx_should_destroy(prof_gctx_t *gctx) {
	if (opt_prof_accum) {
		return false;
	}
	if (!tctx_tree_empty(&gctx->tctxs)) {
		return false;
	}
	if (gctx->nlimbo != 0) {
		return false;
	}
	return true;
}